

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatAttributeReport
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  ctmbstr ptVar3;
  long *local_b0;
  char local_98 [8];
  char tagdesc [64];
  char *local_50;
  char *value;
  char *name;
  AttVal *av;
  __va_list_tag *args_local;
  uint level_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  value = "NULL";
  local_50 = "NULL";
  TagToString(node,local_98,0x40);
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_b0 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_b0 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = local_b0 + 1;
  }
  lVar2 = *local_b0;
  if (lVar2 != 0) {
    if (*(long *)(lVar2 + 0x28) != 0) {
      value = *(char **)(lVar2 + 0x28);
    }
    if (*(long *)(lVar2 + 0x30) != 0) {
      local_50 = *(char **)(lVar2 + 0x30);
    }
  }
  switch(code) {
  case 0x223:
  case 0x224:
  case 0x226:
  case 0x26e:
  case 0x292:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98,local_50);
    break;
  default:
    doc_local = (TidyDocImpl *)0x0;
    break;
  case 0x227:
  case 0x24e:
  case 0x256:
  case 0x26f:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98,value);
    break;
  case 0x228:
  case 0x22a:
  case 0x22b:
  case 0x246:
  case 0x248:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98,value,local_50);
    break;
  case 0x229:
  case 0x23c:
  case 0x240:
  case 0x242:
  case 0x244:
  case 0x245:
  case 0x24d:
  case 0x25c:
  case 0x25d:
  case 0x266:
  case 0x288:
  case 0x289:
  case 0x28a:
  case 0x290:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98);
    break;
  case 0x254:
  case 0x255:
    ptVar3 = HTMLVersion(doc);
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98,value,ptVar3);
    break;
  case 0x25e:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level,value);
    break;
  case 0x272:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,local_98,local_50,value);
    break;
  case 0x283:
    doc->lexer->lines = doc->docIn->curline;
    doc->lexer->columns = doc->docIn->curcol;
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithLexer(doc,code,level,local_98);
  }
  return (TidyMessageImpl *)doc_local;
}

Assistant:

TidyMessageImpl *formatAttributeReport(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    AttVal *av = NULL;
    char const *name = "NULL";
    char const *value = "NULL";
    char tagdesc[64];

    TagToString(node, tagdesc, sizeof(tagdesc));

    if ( ( av = va_arg(args, AttVal*) ) )
    {
        if (av->attribute)
            name = av->attribute;
        if (av->value)
            value = av->value;
    }

    switch (code)
    {
        case MISSING_QUOTEMARK_OPEN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, name );
		
        case BACKSLASH_IN_URI:
        case ESCAPED_ILLEGAL_URI:
        case FIXED_BACKSLASH:
        case ID_NAME_MISMATCH:
        case ILLEGAL_URI_CODEPOINT:
        case ILLEGAL_URI_REFERENCE:
        case INVALID_XML_ID:
        case MISSING_IMAGEMAP:
        case MISSING_QUOTEMARK:
        case NEWLINE_IN_URI:
        case UNEXPECTED_EQUALSIGN:
        case UNEXPECTED_GT:
        case UNEXPECTED_QUOTEMARK:
        case WHITE_IN_URI:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc );

        case ATTRIBUTE_IS_NOT_ALLOWED:
        case JOINING_ATTRIBUTE:
        case MISSING_ATTR_VALUE:
        case PROPRIETARY_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name );

        case ATTRIBUTE_VALUE_REPLACED:
        case BAD_ATTRIBUTE_VALUE:
        case BAD_ATTRIBUTE_VALUE_REPLACED:
        case INSERTING_AUTO_ATTRIBUTE:
        case INVALID_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name, value );

        case MISMATCHED_ATTRIBUTE_ERROR:
        case MISMATCHED_ATTRIBUTE_WARN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, name, HTMLVersion(doc));

        case ANCHOR_NOT_UNIQUE:
        case ANCHOR_DUPLICATED:
        case ATTR_VALUE_NOT_LCASE:
        case PROPRIETARY_ATTR_VALUE:
        case XML_ID_SYNTAX:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, value );

        case REPEATED_ATTRIBUTE:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, tagdesc, value, name );

        case UNEXPECTED_END_OF_FILE_ATTR:
            /* on end of file adjust reported position to end of input */
            doc->lexer->lines   = doc->docIn->curline;
            doc->lexer->columns = doc->docIn->curcol;
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, tagdesc );
    }

    return NULL;
}